

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.cpp
# Opt level: O0

PackageMempoolAcceptResult * __thiscall
anon_unknown.dwarf_2401980::MemPoolAccept::AcceptSubPackage
          (MemPoolAccept *this,
          vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
          *subpackage,ATMPArgs *args)

{
  long lVar1;
  MemPoolAccept *in_RDI;
  long in_FS_OFFSET;
  anon_class_24_3_9fb55dec *in_stack_00000028;
  PackageMempoolAcceptResult *result;
  int in_stack_ffffffffffffff7c;
  char *in_stack_ffffffffffffff80;
  MemPoolAccept *this_00;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = in_RDI;
  AssertLockHeldInternal<AnnotatedMixin<std::recursive_mutex>>
            ((char *)in_RDI,in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c,
             (AnnotatedMixin<std::recursive_mutex> *)0x14c2667);
  AssertLockHeldInternal<AnnotatedMixin<std::recursive_mutex>>
            ((char *)in_RDI,in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c,
             (AnnotatedMixin<std::recursive_mutex> *)0x14c2689);
  AcceptSubPackage::anon_class_24_3_9fb55dec::operator()(in_stack_00000028);
  ClearSubPackageState(this_00);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return (PackageMempoolAcceptResult *)in_RDI;
}

Assistant:

PackageMempoolAcceptResult MemPoolAccept::AcceptSubPackage(const std::vector<CTransactionRef>& subpackage, ATMPArgs& args)
{
    AssertLockHeld(::cs_main);
    AssertLockHeld(m_pool.cs);
    auto result = [&]() EXCLUSIVE_LOCKS_REQUIRED(::cs_main, m_pool.cs) {
        if (subpackage.size() > 1) {
            return AcceptMultipleTransactions(subpackage, args);
        }
        const auto& tx = subpackage.front();
        ATMPArgs single_args = ATMPArgs::SingleInPackageAccept(args);
        const auto single_res = AcceptSingleTransaction(tx, single_args);
        PackageValidationState package_state_wrapped;
        if (single_res.m_result_type != MempoolAcceptResult::ResultType::VALID) {
            package_state_wrapped.Invalid(PackageValidationResult::PCKG_TX, "transaction failed");
        }
        return PackageMempoolAcceptResult(package_state_wrapped, {{tx->GetWitnessHash(), single_res}});
    }